

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O2

int text_nthline(int n,t_atom *vec,int line,int *startp,int *endp)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  uVar1 = 0;
  iVar3 = 0;
  while( true ) {
    if (uVar2 == uVar1) {
      return 0;
    }
    if (iVar3 == line) break;
    iVar3 = iVar3 + (uint)((vec->a_type & ~A_FLOAT) == A_SEMI);
    uVar1 = uVar1 + 1;
    vec = vec + 1;
  }
  iVar3 = (int)uVar1;
  uVar2 = (ulong)(uint)n;
  if (n <= iVar3) {
    uVar2 = uVar1 & 0xffffffff;
  }
  do {
    if (uVar2 == uVar1) {
LAB_00186a58:
      *startp = iVar3;
      *endp = (int)uVar2;
      return 1;
    }
    if ((vec->a_type & ~A_FLOAT) == A_SEMI) {
      uVar2 = uVar1 & 0xffffffff;
      goto LAB_00186a58;
    }
    uVar1 = uVar1 + 1;
    vec = vec + 1;
  } while( true );
}

Assistant:

static int text_nthline(int n, t_atom *vec, int line, int *startp, int *endp)
{
    int i, cnt = 0;
    for (i = 0; i < n; i++)
    {
        if (cnt == line)
        {
            int j = i;
            while (j < n && vec[j].a_type != A_SEMI &&
                vec[j].a_type != A_COMMA)
                    j++;
            *startp = i;
            *endp = j;
            return (1);
        }
        else if (vec[i].a_type == A_SEMI || vec[i].a_type == A_COMMA)
            cnt++;
    }
    return (0);
}